

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-write-test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  size_t sVar2;
  int error_2;
  int error_1;
  int error;
  char *str2;
  char *str1;
  mtar_t tar;
  char **argv_local;
  int argc_local;
  
  tar.memory_capacity = (size_t)argv;
  if (argc < 2) {
    printf("error: no argument\n");
    argv_local._4_4_ = 1;
  }
  else {
    uVar1 = mtar_open((mtar_t *)&str1,argv[1],"w");
    if (uVar1 == 0) {
      sVar2 = strlen("Hello world");
      mtar_write_file_header((mtar_t *)&str1,"test1.txt",sVar2);
      sVar2 = strlen("Hello world");
      mtar_write_data((mtar_t *)&str1,"Hello world",sVar2);
      sVar2 = strlen("Goodbye world");
      mtar_write_file_header((mtar_t *)&str1,"test2.txt",sVar2);
      sVar2 = strlen("Goodbye world");
      mtar_write_data((mtar_t *)&str1,"Goodbye world",sVar2);
      uVar1 = mtar_finalize((mtar_t *)&str1);
      if (uVar1 == 0) {
        uVar1 = mtar_close((mtar_t *)&str1);
        if (uVar1 == 0) {
          puts("success");
          argv_local._4_4_ = 0;
        }
        else {
          printf("error: %d\n",(ulong)uVar1);
          argv_local._4_4_ = 4;
        }
      }
      else {
        printf("error: %d\n",(ulong)uVar1);
        argv_local._4_4_ = 3;
      }
    }
    else {
      printf("error: %d\n",(ulong)uVar1);
      argv_local._4_4_ = 2;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    const char *str1 = "Hello world";
    const char *str2 = "Goodbye world";

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    if (int error = mtar_open(&tar, argv[1], "w"))
    {
        printf("error: %d\n", error);
        return 2;
    }

    mtar_write_file_header(&tar, "test1.txt", strlen(str1));
    mtar_write_data(&tar, str1, strlen(str1));
    mtar_write_file_header(&tar, "test2.txt", strlen(str2));
    mtar_write_data(&tar, str2, strlen(str2));

    if (int error = mtar_finalize(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 4;
    }

    puts("success");
    return 0;
}